

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3BeginTrigger(Parse *pParse,Token *pName1,Token *pName2,int tr_tm,int op,IdList *pColumns
                        ,SrcList *pTableName,Expr *pWhen,int isTemp,int noErr)

{
  uchar uVar1;
  sqlite3 *db;
  Db *pDVar2;
  char *zArg3;
  Token *pName_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  Table *pTVar6;
  char *zName;
  HashElem *pHVar7;
  Trigger *pTrigger;
  Expr *pEVar8;
  IdList *pIVar9;
  long lVar10;
  char *pcVar11;
  Schema **ppSVar12;
  uchar uVar13;
  char *zArg3_00;
  ulong uVar14;
  ulong uVar15;
  Token *pName;
  uint h;
  DbFixer sFix;
  Token *local_70;
  uint local_64;
  DbFixer local_60;
  
  db = pParse->db;
  if (isTemp == 0) {
    uVar3 = sqlite3TwoPartName(pParse,pName1,pName2,&local_70);
    uVar14 = (ulong)uVar3;
    if (pTableName == (SrcList *)0x0 || (int)uVar3 < 0) goto LAB_0014c7f0;
LAB_0014c71d:
    if (db->mallocFailed != '\0') goto LAB_0014c7f0;
    if (((int)uVar14 != 1) && ((db->init).busy != '\0')) {
      sqlite3DbFree(db,pTableName->a[0].zDatabase);
      pTableName->a[0].zDatabase = (char *)0x0;
    }
    pTVar6 = sqlite3SrcListLookup(pParse,pTableName);
    pName_00 = local_70;
    if ((((db->init).busy == '\0') && (pTVar6 != (Table *)0x0 && pName2->n == 0)) &&
       (pTVar6->pSchema == db->aDb[1].pSchema)) {
      uVar14 = 1;
    }
    if (db->mallocFailed != '\0') goto LAB_0014c7f0;
    pDVar2 = pParse->db->aDb;
    local_60.zDb = pDVar2[uVar14].zName;
    local_60.pSchema = pDVar2[uVar14].pSchema;
    local_60.zType = "trigger";
    local_60.pName = local_70;
    local_60.bVarOnly = (int)((int)uVar14 == 1);
    local_60.pParse = pParse;
    iVar4 = sqlite3FixSrcList(&local_60,pTableName);
    if (iVar4 != 0) goto LAB_0014c7f0;
    pTVar6 = sqlite3SrcListLookup(pParse,pTableName);
    if (pTVar6 == (Table *)0x0) {
      if ((db->init).iDb == '\x01') {
        (db->init).orphanTrigger = '\x01';
      }
      zName = (char *)0x0;
LAB_0014c921:
      pTrigger = (Trigger *)0x0;
      goto LAB_0014c7fa;
    }
    if ((pTVar6->tabFlags & 0x10) != 0) {
      pcVar11 = "cannot create triggers on virtual tables";
      goto LAB_0014c6ba;
    }
    zName = sqlite3NameFromToken(db,pName_00);
    if (zName == (char *)0x0) goto LAB_0014c7f0;
    iVar4 = sqlite3CheckObjectName(pParse,zName);
    if (iVar4 == 0) {
      pDVar2 = db->aDb;
      pHVar7 = findElementWithHash(&(pDVar2[uVar14].pSchema)->trigHash,zName,&local_64);
      if ((pHVar7 != (HashElem *)0x0) && (pHVar7->data != (void *)0x0)) {
        if (noErr == 0) {
          pTrigger = (Trigger *)0x0;
          sqlite3ErrorMsg(pParse,"trigger %T already exists",pName_00);
          goto LAB_0014c7fa;
        }
        sqlite3CodeVerifySchema(pParse,(int)uVar14);
        goto LAB_0014c921;
      }
      pcVar11 = pTVar6->zName;
      if (pcVar11 == (char *)0x0) {
LAB_0014c9c8:
        if (tr_tm == 0x31 || pTVar6->pSelect == (Select *)0x0) {
          if (tr_tm == 0x31 && pTVar6->pSelect == (Select *)0x0) {
            sqlite3ErrorMsg(pParse,"cannot create INSTEAD OF trigger on table: %S",pTableName,0);
          }
          else {
            if (pTVar6->pSchema == (Schema *)0x0) {
              uVar15 = 0xfff0bdc0;
            }
            else {
              uVar3 = db->nDb;
              if ((int)uVar3 < 1) {
                uVar15 = 0;
              }
              else {
                ppSVar12 = &pDVar2->pSchema;
                uVar15 = 0;
                do {
                  if (*ppSVar12 == pTVar6->pSchema) goto LAB_0014ca8f;
                  uVar15 = uVar15 + 1;
                  ppSVar12 = ppSVar12 + 4;
                } while (uVar3 != uVar15);
                uVar15 = (ulong)uVar3;
              }
            }
LAB_0014ca8f:
            iVar4 = (int)uVar15;
            zArg3 = pDVar2[iVar4].zName;
            zArg3_00 = zArg3;
            if (isTemp != 0) {
              zArg3_00 = pDVar2[1].zName;
            }
            iVar5 = 5;
            if (isTemp == 0) {
              iVar5 = (iVar4 != 1) + 5 + (uint)(iVar4 != 1);
            }
            iVar5 = sqlite3AuthCheck(pParse,iVar5,zName,pcVar11,zArg3_00);
            if (iVar5 == 0) {
              pcVar11 = "sqlite_master";
              if (iVar4 == 1) {
                pcVar11 = "sqlite_temp_master";
              }
              iVar4 = sqlite3AuthCheck(pParse,0x12,pcVar11,(char *)0x0,zArg3);
              if ((iVar4 == 0) &&
                 (pTrigger = (Trigger *)sqlite3DbMallocRaw(db,0x48), pTrigger != (Trigger *)0x0)) {
                pTrigger->step_list = (TriggerStep *)0x0;
                pTrigger->pNext = (Trigger *)0x0;
                pTrigger->pSchema = (Schema *)0x0;
                pTrigger->pTabSchema = (Schema *)0x0;
                pTrigger->pWhen = (Expr *)0x0;
                pTrigger->pColumns = (IdList *)0x0;
                pTrigger->table = (char *)0x0;
                pTrigger->op = '\0';
                pTrigger->tr_tm = '\0';
                *(undefined6 *)&pTrigger->field_0x12 = 0;
                pTrigger->zName = zName;
                pcVar11 = sqlite3DbStrDup(db,pTableName->a[0].zName);
                pTrigger->table = pcVar11;
                pTrigger->pSchema = db->aDb[uVar14].pSchema;
                pTrigger->pTabSchema = pTVar6->pSchema;
                pTrigger->op = (u8)op;
                pTrigger->tr_tm = '\x02' - (tr_tm == 0x23 || tr_tm == 0x31);
                zName = (char *)0x0;
                pEVar8 = exprDup(db,pWhen,1,(u8 **)0x0);
                pTrigger->pWhen = pEVar8;
                pIVar9 = sqlite3IdListDup(db,pColumns);
                pTrigger->pColumns = pIVar9;
                pParse->pNewTrigger = pTrigger;
                goto LAB_0014c7fa;
              }
            }
          }
        }
        else {
          pcVar11 = "AFTER";
          if (tr_tm == 0x23) {
            pcVar11 = "BEFORE";
          }
          sqlite3ErrorMsg(pParse,"cannot create %s trigger on view: %S",pcVar11,pTableName,0);
        }
      }
      else {
        lVar10 = 0;
        do {
          if ((ulong)(byte)pcVar11[lVar10] == 0) {
            uVar1 = ""[(byte)"sqlite_"[lVar10]];
            uVar13 = '\0';
LAB_0014c9a4:
            if (uVar13 != uVar1) goto LAB_0014c9c8;
            break;
          }
          uVar13 = ""[(byte)pcVar11[lVar10]];
          uVar1 = ""[(byte)"sqlite_"[lVar10]];
          if (uVar13 != uVar1) goto LAB_0014c9a4;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 7);
        sqlite3ErrorMsg(pParse,"cannot create trigger on system table");
        pParse->nErr = pParse->nErr + 1;
      }
    }
  }
  else {
    if (pName2->n != 0) {
      pcVar11 = "temporary trigger may not have qualified name";
LAB_0014c6ba:
      zName = (char *)0x0;
      sqlite3ErrorMsg(pParse,pcVar11);
      goto LAB_0014c7f5;
    }
    uVar14 = 1;
    local_70 = pName1;
    if (pTableName != (SrcList *)0x0) goto LAB_0014c71d;
LAB_0014c7f0:
    zName = (char *)0x0;
  }
LAB_0014c7f5:
  pTrigger = (Trigger *)0x0;
LAB_0014c7fa:
  sqlite3DbFree(db,zName);
  sqlite3SrcListDelete(db,pTableName);
  sqlite3IdListDelete(db,pColumns);
  sqlite3ExprDelete(db,pWhen);
  if (pParse->pNewTrigger == (Trigger *)0x0) {
    sqlite3DeleteTrigger(db,pTrigger);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTrigger(
  Parse *pParse,      /* The parse context of the CREATE TRIGGER statement */
  Token *pName1,      /* The name of the trigger */
  Token *pName2,      /* The name of the trigger */
  int tr_tm,          /* One of TK_BEFORE, TK_AFTER, TK_INSTEAD */
  int op,             /* One of TK_INSERT, TK_UPDATE, TK_DELETE */
  IdList *pColumns,   /* column list if this is an UPDATE OF trigger */
  SrcList *pTableName,/* The name of the table/view the trigger applies to */
  Expr *pWhen,        /* WHEN clause */
  int isTemp,         /* True if the TEMPORARY keyword is present */
  int noErr           /* Suppress errors if the trigger already exists */
){
  Trigger *pTrigger = 0;  /* The new trigger */
  Table *pTab;            /* Table that the trigger fires off of */
  char *zName = 0;        /* Name of the trigger */
  sqlite3 *db = pParse->db;  /* The database connection */
  int iDb;                /* The database to store the trigger in */
  Token *pName;           /* The unqualified db name */
  DbFixer sFix;           /* State vector for the DB fixer */
  int iTabDb;             /* Index of the database holding pTab */

  assert( pName1!=0 );   /* pName1->z might be NULL, but not pName1 itself */
  assert( pName2!=0 );
  assert( op==TK_INSERT || op==TK_UPDATE || op==TK_DELETE );
  assert( op>0 && op<0xff );
  if( isTemp ){
    /* If TEMP was specified, then the trigger name may not be qualified. */
    if( pName2->n>0 ){
      sqlite3ErrorMsg(pParse, "temporary trigger may not have qualified name");
      goto trigger_cleanup;
    }
    iDb = 1;
    pName = pName1;
  }else{
    /* Figure out the db that the trigger will be created in */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ){
      goto trigger_cleanup;
    }
  }
  if( !pTableName || db->mallocFailed ){
    goto trigger_cleanup;
  }

  /* A long-standing parser bug is that this syntax was allowed:
  **
  **    CREATE TRIGGER attached.demo AFTER INSERT ON attached.tab ....
  **                                                 ^^^^^^^^
  **
  ** To maintain backwards compatibility, ignore the database
  ** name on pTableName if we are reparsing out of SQLITE_MASTER.
  */
  if( db->init.busy && iDb!=1 ){
    sqlite3DbFree(db, pTableName->a[0].zDatabase);
    pTableName->a[0].zDatabase = 0;
  }

  /* If the trigger name was unqualified, and the table is a temp table,
  ** then set iDb to 1 to create the trigger in the temporary database.
  ** If sqlite3SrcListLookup() returns 0, indicating the table does not
  ** exist, the error is caught by the block below.
  */
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( db->init.busy==0 && pName2->n==0 && pTab
        && pTab->pSchema==db->aDb[1].pSchema ){
    iDb = 1;
  }

  /* Ensure the table name matches database name and that the table exists */
  if( db->mallocFailed ) goto trigger_cleanup;
  assert( pTableName->nSrc==1 );
  sqlite3FixInit(&sFix, pParse, iDb, "trigger", pName);
  if( sqlite3FixSrcList(&sFix, pTableName) ){
    goto trigger_cleanup;
  }
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( !pTab ){
    /* The table does not exist. */
    if( db->init.iDb==1 ){
      /* Ticket #3810.
      ** Normally, whenever a table is dropped, all associated triggers are
      ** dropped too.  But if a TEMP trigger is created on a non-TEMP table
      ** and the table is dropped by a different database connection, the
      ** trigger is not visible to the database connection that does the
      ** drop so the trigger cannot be dropped.  This results in an
      ** "orphaned trigger" - a trigger whose associated table is missing.
      */
      db->init.orphanTrigger = 1;
    }
    goto trigger_cleanup;
  }
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "cannot create triggers on virtual tables");
    goto trigger_cleanup;
  }

  /* Check that the trigger name is not reserved and that no trigger of the
  ** specified name exists */
  zName = sqlite3NameFromToken(db, pName);
  if( !zName || SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
    goto trigger_cleanup;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  if( sqlite3HashFind(&(db->aDb[iDb].pSchema->trigHash),zName) ){
    if( !noErr ){
      sqlite3ErrorMsg(pParse, "trigger %T already exists", pName);
    }else{
      assert( !db->init.busy );
      sqlite3CodeVerifySchema(pParse, iDb);
    }
    goto trigger_cleanup;
  }

  /* Do not create a trigger on a system table */
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 ){
    sqlite3ErrorMsg(pParse, "cannot create trigger on system table");
    pParse->nErr++;
    goto trigger_cleanup;
  }

  /* INSTEAD of triggers are only for views and views only support INSTEAD
  ** of triggers.
  */
  if( pTab->pSelect && tr_tm!=TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create %s trigger on view: %S", 
        (tr_tm == TK_BEFORE)?"BEFORE":"AFTER", pTableName, 0);
    goto trigger_cleanup;
  }
  if( !pTab->pSelect && tr_tm==TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create INSTEAD OF"
        " trigger on table: %S", pTableName, 0);
    goto trigger_cleanup;
  }
  iTabDb = sqlite3SchemaToIndex(db, pTab->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code = SQLITE_CREATE_TRIGGER;
    const char *zDb = db->aDb[iTabDb].zName;
    const char *zDbTrig = isTemp ? db->aDb[1].zName : zDb;
    if( iTabDb==1 || isTemp ) code = SQLITE_CREATE_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, zName, pTab->zName, zDbTrig) ){
      goto trigger_cleanup;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iTabDb),0,zDb)){
      goto trigger_cleanup;
    }
  }
#endif

  /* INSTEAD OF triggers can only appear on views and BEFORE triggers
  ** cannot appear on views.  So we might as well translate every
  ** INSTEAD OF trigger into a BEFORE trigger.  It simplifies code
  ** elsewhere.
  */
  if (tr_tm == TK_INSTEAD){
    tr_tm = TK_BEFORE;
  }

  /* Build the Trigger object */
  pTrigger = (Trigger*)sqlite3DbMallocZero(db, sizeof(Trigger));
  if( pTrigger==0 ) goto trigger_cleanup;
  pTrigger->zName = zName;
  zName = 0;
  pTrigger->table = sqlite3DbStrDup(db, pTableName->a[0].zName);
  pTrigger->pSchema = db->aDb[iDb].pSchema;
  pTrigger->pTabSchema = pTab->pSchema;
  pTrigger->op = (u8)op;
  pTrigger->tr_tm = tr_tm==TK_BEFORE ? TRIGGER_BEFORE : TRIGGER_AFTER;
  pTrigger->pWhen = sqlite3ExprDup(db, pWhen, EXPRDUP_REDUCE);
  pTrigger->pColumns = sqlite3IdListDup(db, pColumns);
  assert( pParse->pNewTrigger==0 );
  pParse->pNewTrigger = pTrigger;

trigger_cleanup:
  sqlite3DbFree(db, zName);
  sqlite3SrcListDelete(db, pTableName);
  sqlite3IdListDelete(db, pColumns);
  sqlite3ExprDelete(db, pWhen);
  if( !pParse->pNewTrigger ){
    sqlite3DeleteTrigger(db, pTrigger);
  }else{
    assert( pParse->pNewTrigger==pTrigger );
  }
}